

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

_Bool monster_can_kill(monster *mon,loc_conflict grid)

{
  _Bool _Var1;
  monster *mon_00;
  monster_race *pmVar2;
  monster_race *pmVar3;
  
  mon_00 = square_monster(cave,(loc)grid);
  _Var1 = true;
  if (mon_00 != (monster *)0x0) {
    _Var1 = monster_is_unique(mon_00);
    if ((!_Var1) &&
       (_Var1 = flag_has_dbg(mon->race->flags,0xb,0x32,"mon->race->flags","RF_KILL_BODY"), _Var1)) {
      pmVar2 = mon->original_race;
      if (pmVar2 == (monster_race *)0x0) {
        pmVar2 = mon->race;
      }
      pmVar3 = mon_00->original_race;
      if (pmVar3 == (monster_race *)0x0) {
        pmVar3 = mon_00->race;
      }
      if ((uint)pmVar3->mexp < (uint)pmVar2->mexp) {
        return true;
      }
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool monster_can_kill(struct monster *mon, struct loc grid)
{
	struct monster *mon1 = square_monster(cave, grid);

	/* No monster */
	if (!mon1) return true;

	/* No trampling uniques */
	if (monster_is_unique(mon1)) {
		return false;
	}

	if (rf_has(mon->race->flags, RF_KILL_BODY) &&
		compare_monsters(mon, mon1) > 0) {
		return true;
	}

	return false;
}